

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int execute_filter_e8(rar_filter *filter,rar_virtual_machine *vm,size_t pos,int e9also)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = filter->initialregisters[4];
  iVar2 = 0;
  if (0xfffc4003 < uVar1 - 0x3c001) {
    uVar4 = 0;
    do {
      if ((vm->memory[uVar4] == 0xe8) || (e9also != 0 && vm->memory[uVar4] == 0xe9)) {
        uVar5 = (int)pos + 1 + uVar4;
        uVar3 = *(uint *)(vm->memory + (long)(int)uVar4 + 1);
        if (uVar5 < -uVar3 || -1 < (int)uVar3) {
          if (uVar3 < 0x1000000) {
            uVar3 = uVar3 - uVar5;
            uVar5 = uVar3;
            goto LAB_0013097b;
          }
        }
        else {
          uVar5 = uVar3 + 0x1000000;
LAB_0013097b:
          vm->memory[(long)(int)uVar4 + 1] = (uint8_t)uVar3;
          vm->memory[(long)(int)uVar4 + 2] = (uint8_t)(uVar3 >> 8);
          vm->memory[(long)(int)uVar4 + 3] = (uint8_t)(uVar3 >> 0x10);
          vm->memory[(long)(int)uVar4 + 4] = (uint8_t)(uVar5 >> 0x18);
        }
        uVar4 = uVar4 + 4;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 <= uVar1 - 5);
    filter->filteredblockaddress = 0;
    filter->filteredblocklength = uVar1;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
execute_filter_e8(struct rar_filter *filter, struct rar_virtual_machine *vm, size_t pos, int e9also)
{
  uint32_t length = filter->initialregisters[4];
  uint32_t filesize = 0x1000000;
  uint32_t i;

  if (length > PROGRAM_WORK_SIZE || length <= 4)
    return 0;

  for (i = 0; i <= length - 5; i++)
  {
    if (vm->memory[i] == 0xE8 || (e9also && vm->memory[i] == 0xE9))
    {
      uint32_t currpos = (uint32_t)pos + i + 1;
      int32_t address = (int32_t)vm_read_32(vm, i + 1);
      if (address < 0 && currpos >= (~(uint32_t)address + 1))
        vm_write_32(vm, i + 1, address + filesize);
      else if (address >= 0 && (uint32_t)address < filesize)
        vm_write_32(vm, i + 1, address - currpos);
      i += 4;
    }
  }

  filter->filteredblockaddress = 0;
  filter->filteredblocklength = length;

  return 1;
}